

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript_tests.cpp
# Opt level: O0

optional<CPubKey> * __thiscall
(anonymous_namespace)::KeyConverter::
FromPKBytes<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (KeyConverter *this,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          first,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                last)

{
  long lVar1;
  bool bVar2;
  difference_type dVar3;
  XOnlyPubKey *in_RDX;
  optional<CPubKey> *in_RSI;
  optional<CPubKey> *in_RDI;
  long in_FS_OFFSET;
  XOnlyPubKey xonly_pubkey;
  Key key;
  optional<CPubKey> *__t;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffff20;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffff28;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffff30;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffff38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __t = in_RDI;
  bVar2 = miniscript::IsTapscript((MiniscriptContext)in_RDI);
  if (bVar2) {
    dVar3 = __gnu_cxx::operator-
                      ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)in_RSI,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)__t);
    if (dVar3 == 0x20) {
      XOnlyPubKey::XOnlyPubKey((XOnlyPubKey *)in_RDI);
      XOnlyPubKey::begin((XOnlyPubKey *)in_RDI);
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*>
                (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,(uchar *)in_RSI);
      XOnlyPubKey::GetEvenCorrespondingCPubKey(in_RDX);
      std::optional<CPubKey>::optional<CPubKey,_true>(in_RSI,(CPubKey *)__t);
    }
    else {
      std::optional<CPubKey>::optional(in_RDI);
    }
  }
  else {
    CPubKey::
    CPubKey<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((CPubKey *)in_RDI,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    bVar2 = CPubKey::IsValid((CPubKey *)in_RDI);
    if (bVar2) {
      std::optional<CPubKey>::optional<CPubKey,_true>(in_RSI,(CPubKey *)__t);
    }
    else {
      std::optional<CPubKey>::optional(in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __t;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<Key> FromPKBytes(I first, I last) const {
        if (!miniscript::IsTapscript(m_script_ctx)) {
            Key key{first, last};
            if (key.IsValid()) return key;
            return {};
        }
        if (last - first != 32) return {};
        XOnlyPubKey xonly_pubkey;
        std::copy(first, last, xonly_pubkey.begin());
        return xonly_pubkey.GetEvenCorrespondingCPubKey();
    }